

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

string * __thiscall
InstructionAtom::get_sym_abi_cxx11_(string *__return_storage_ptr__,InstructionAtom *this)

{
  if (this->kind == IMM_SYM) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->sym);
    return __return_storage_ptr__;
  }
  __assert_fail("kind == IMM_SYM",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/Instruction.cpp"
                ,0x6b,"std::string InstructionAtom::get_sym() const");
}

Assistant:

std::string InstructionAtom::get_sym() const {
  assert(kind == IMM_SYM);
  return sym;
}